

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

void __thiscall
TCMallocImplementation::GetFreeListSizes
          (TCMallocImplementation *this,
          vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_> *v)

{
  int64_t *__x;
  int iVar1;
  long lVar2;
  Elf64_Ehdr *pEVar3;
  long lVar4;
  CentralFreeList *this_00;
  long lVar5;
  ulong uVar6;
  uint64_t local_c88;
  uint64_t class_count [128];
  SmallSpanStats small;
  LargeSpanStats large;
  FreeListInfo span_info;
  FreeListInfo i_2;
  
  if (*(long *)(v + 8) != *(long *)v) {
    *(long *)(v + 8) = *(long *)v;
  }
  this_00 = (CentralFreeList *)(tcmalloc::Static::central_cache_ + 0x4c0);
  lVar2 = 0;
  for (lVar4 = 0x2a0; lVar4 - 0x29fU < (ulong)DAT_00125d90; lVar4 = lVar4 + 1) {
    lVar5 = (long)*(int *)(&tcmalloc::Static::sizemap_ + lVar4 * 4);
    class_count[0x7f] = lVar2 + 1;
    small.normal_length[0] = lVar5;
    iVar1 = tcmalloc::CentralFreeList::length(this_00);
    small.normal_length[1] = iVar1 * lVar5;
    small.normal_length[2] = (int64_t)GetFreeListSizes::kCentralCacheType;
    std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
    push_back(v,(value_type *)(class_count + 0x7f));
    iVar1 = tcmalloc::CentralFreeList::tc_length(this_00);
    small.normal_length[1] = iVar1 * lVar5;
    small.normal_length[2] = (int64_t)GetFreeListSizes::kTransferCacheType;
    std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
    push_back(v,(value_type *)(class_count + 0x7f));
    lVar2 = (long)*(int *)(&tcmalloc::Static::sizemap_ + lVar4 * 4);
    this_00 = this_00 + 1;
  }
  memset(&local_c88,0,0x400);
  class_count[0x7f] = 0x14be40;
  SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
  large.returned_pages = 0;
  tcmalloc::ThreadCache::GetThreadStats((uint64_t *)&large.returned_pages,&local_c88);
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)(class_count + 0x7f));
  lVar2 = 0;
  uVar6 = 0;
  while (uVar6 + 1 < (ulong)DAT_00125d90) {
    class_count[0x7f] = lVar2 + 1;
    small.normal_length[0] = (long)(int)(&DAT_00125788)[uVar6];
    small.normal_length[1] = (long)(int)(&DAT_00125788)[uVar6] * class_count[uVar6];
    small.normal_length[2] = (int64_t)GetFreeListSizes::kThreadCacheType;
    std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
    push_back(v,(value_type *)(class_count + 0x7f));
    lVar2 = (long)(int)(&DAT_00125788)[uVar6];
    uVar6 = uVar6 + 1;
  }
  large.returned_pages = 0x14be40;
  SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
  tcmalloc::PageHeap::GetSmallSpanStatsLocked
            ((PageHeap *)tcmalloc::Static::pageheap_,(SmallSpanStats *)(class_count + 0x7f));
  tcmalloc::PageHeap::GetLargeSpanStatsLocked
            ((PageHeap *)tcmalloc::Static::pageheap_,
             (LargeSpanStats *)(small.returned_length + 0x7f));
  __x = &large.returned_pages;
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)__x);
  span_info.total_bytes_free = (size_t)GetFreeListSizes::kLargeSpanType;
  span_info.min_object_size = 0xffffffffffffffff;
  large.returned_pages = 0x100000;
  span_info.max_object_size = large.spans << 0xd;
  std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
  push_back(v,(value_type *)__x);
  span_info.total_bytes_free = (size_t)GetFreeListSizes::kLargeUnmappedSpanType;
  span_info.max_object_size = large.normal_pages << 0xd;
  std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
  push_back(v,(value_type *)__x);
  for (pEVar3 = (Elf64_Ehdr *)0x0; pEVar3 != &Elf64_Ehdr_00100000; pEVar3 = pEVar3 + 0x80) {
    span_info.type = (char *)pEVar3;
    std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
    push_back(v,(value_type *)&span_info.type);
    std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
    push_back(v,(value_type *)&span_info.type);
  }
  return;
}

Assistant:

virtual void GetFreeListSizes(std::vector<MallocExtension::FreeListInfo>* v) {
    static const char kCentralCacheType[] = "tcmalloc.central";
    static const char kTransferCacheType[] = "tcmalloc.transfer";
    static const char kThreadCacheType[] = "tcmalloc.thread";
    static const char kPageHeapType[] = "tcmalloc.page";
    static const char kPageHeapUnmappedType[] = "tcmalloc.page_unmapped";
    static const char kLargeSpanType[] = "tcmalloc.large";
    static const char kLargeUnmappedSpanType[] = "tcmalloc.large_unmapped";

    v->clear();

    // central class information
    int64_t prev_class_size = 0;
    for (int cl = 1; cl < Static::num_size_classes(); ++cl) {
      size_t class_size = Static::sizemap()->ByteSizeForClass(cl);
      MallocExtension::FreeListInfo i;
      i.min_object_size = prev_class_size + 1;
      i.max_object_size = class_size;
      i.total_bytes_free =
          Static::central_cache()[cl].length() * class_size;
      i.type = kCentralCacheType;
      v->push_back(i);

      // transfer cache
      i.total_bytes_free =
          Static::central_cache()[cl].tc_length() * class_size;
      i.type = kTransferCacheType;
      v->push_back(i);

      prev_class_size = Static::sizemap()->ByteSizeForClass(cl);
    }

    // Add stats from per-thread heaps
    uint64_t class_count[kClassSizesMax];
    memset(class_count, 0, sizeof(class_count));
    {
      SpinLockHolder h(Static::pageheap_lock());
      uint64_t thread_bytes = 0;
      ThreadCache::GetThreadStats(&thread_bytes, class_count);
    }

    prev_class_size = 0;
    for (int cl = 1; cl < Static::num_size_classes(); ++cl) {
      MallocExtension::FreeListInfo i;
      i.min_object_size = prev_class_size + 1;
      i.max_object_size = Static::sizemap()->ByteSizeForClass(cl);
      i.total_bytes_free =
          class_count[cl] * Static::sizemap()->ByteSizeForClass(cl);
      i.type = kThreadCacheType;
      v->push_back(i);

      prev_class_size = Static::sizemap()->ByteSizeForClass(cl);
    }

    // append page heap info
    PageHeap::SmallSpanStats small;
    PageHeap::LargeSpanStats large;
    {
      SpinLockHolder h(Static::pageheap_lock());
      Static::pageheap()->GetSmallSpanStatsLocked(&small);
      Static::pageheap()->GetLargeSpanStatsLocked(&large);
    }

    // large spans: mapped
    MallocExtension::FreeListInfo span_info;
    span_info.type = kLargeSpanType;
    span_info.max_object_size = (std::numeric_limits<size_t>::max)();
    span_info.min_object_size = kMaxPages << kPageShift;
    span_info.total_bytes_free = large.normal_pages << kPageShift;
    v->push_back(span_info);

    // large spans: unmapped
    span_info.type = kLargeUnmappedSpanType;
    span_info.total_bytes_free = large.returned_pages << kPageShift;
    v->push_back(span_info);

    // small spans
    for (int s = 1; s <= kMaxPages; s++) {
      MallocExtension::FreeListInfo i;
      i.max_object_size = (s << kPageShift);
      i.min_object_size = ((s - 1) << kPageShift);

      i.type = kPageHeapType;
      i.total_bytes_free = (s << kPageShift) * small.normal_length[s - 1];
      v->push_back(i);

      i.type = kPageHeapUnmappedType;
      i.total_bytes_free = (s << kPageShift) * small.returned_length[s - 1];
      v->push_back(i);
    }
  }